

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void group_gain(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CHAR_DATA *pCVar5;
  CHAR_DATA *pCVar6;
  ulong uVar7;
  char *__format;
  char *pcVar8;
  int iVar9;
  int glevel;
  char buf [4608];
  char *local_1250;
  char local_1238 [4616];
  
  if (victim != ch) {
    bVar1 = is_npc(victim);
    pCVar6 = ch->in_room->people;
    if (pCVar6 == (CHAR_DATA *)0x0) {
      iVar9 = 0;
      glevel = 0;
    }
    else {
      glevel = 0;
      iVar9 = 0;
      do {
        bVar2 = is_same_group(pCVar6,ch);
        if (bVar2) {
          bVar2 = is_npc(pCVar6);
          if ((!bVar2) || (pCVar5 = pCVar6->master, pCVar6->master == (CHAR_DATA *)0x0)) {
            pCVar5 = pCVar6;
          }
          iVar9 = iVar9 + 1;
          glevel = glevel + pCVar5->level;
        }
        pCVar6 = pCVar6->next_in_room;
      } while (pCVar6 != (CHAR_DATA *)0x0);
    }
    iVar9 = iVar9 + (uint)(iVar9 == 0);
    pCVar6 = ch->leader;
    if (ch->leader == (CHAR_DATA *)0x0) {
      pCVar6 = ch;
    }
    if (ch->in_room != (ROOM_INDEX_DATA *)0x0) {
      for (pCVar5 = ch->in_room->people; pCVar5 != (CHAR_DATA *)0x0; pCVar5 = pCVar5->next_in_room)
      {
        bVar2 = is_same_group(pCVar5,ch);
        if (bVar2) {
          iVar3 = (int)pCVar5->level - (int)pCVar6->level;
          if (iVar3 < 9) {
            if (-9 < iVar3) {
              if (bVar1) {
                uVar4 = xp_compute(pCVar5,victim,iVar9,glevel);
              }
              else {
                uVar4 = xp_compute_pk(pCVar5,victim,iVar9);
              }
              uVar7 = 0;
              if (0 < (int)uVar4) {
                uVar7 = (ulong)uVar4;
              }
              if (pCVar5->level < 0x33) {
                local_1250 = get_char_color(pCVar5,"white");
                pcVar8 = END_COLOR(pCVar5);
                if ((int)uVar4 < 1) {
                  __format = "%sYou receive no experience from this victory.%s\n\r";
                  goto LAB_00297888;
                }
                sprintf(local_1238,"%sYou receive %d experience points.%s\n\r",local_1250,uVar7,
                        pcVar8);
              }
              else {
                local_1250 = get_char_color(pCVar5,"white");
                pcVar8 = END_COLOR(pCVar5);
                __format = "%sYou have already reached the pinnacle of your learning.%s\n\r";
LAB_00297888:
                sprintf(local_1238,__format,local_1250,pcVar8);
              }
              send_to_char(local_1238,pCVar5);
              gain_exp(pCVar5,(int)uVar7);
              goto LAB_002978b6;
            }
            pcVar8 = "You are too low for this group.\n\r";
          }
          else {
            pcVar8 = "You are too high for this group.\n\r";
          }
          send_to_char(pcVar8,pCVar5);
        }
LAB_002978b6:
      }
    }
  }
  return;
}

Assistant:

void group_gain(CHAR_DATA *ch, CHAR_DATA *victim)
{
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *gch;
	CHAR_DATA *lch;
	int xp;
	int members;
	int group_levels;
	bool ispk = false;

	/*
	 * Monsters don't get kill xp's or alignment changes.
	 * P-killing doesn't help either.
	 * Dying of mortal wounds or poison doesn't give xp to anyone!
	 */

	if (victim == ch)
		return;

	if (!is_npc(victim))
		ispk = true;

	members = 0;
	group_levels = 0;

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (is_same_group(gch, ch))
		{
			// if(!is_npc(gch))
			members++;
			group_levels += (is_npc(gch) && gch->master) ? gch->master->level : gch->level;
			// note: the preceding code skews the group average a bit in favor of the group leader if there's npcs in
			// the group but i don't really care
		}
	}

	if (members == 0)
		members = 1;

	lch = (ch->leader != nullptr) ? ch->leader : ch;

	if (ch->in_room == nullptr)
		return;

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (!is_same_group(gch, ch)) // || is_npc(gch))
			continue;

		if (gch->level - lch->level > 8)
		{
			send_to_char("You are too high for this group.\n\r", gch);
			continue;
		}

		if (gch->level - lch->level < -8)
		{
			send_to_char("You are too low for this group.\n\r", gch);
			continue;
		}

		if (!ispk)
			xp = xp_compute(gch, victim, members, group_levels);
		else
			xp = xp_compute_pk(gch, victim, members);

		if (xp < 0)
			xp = 0;

		if (gch->level < 51)
		{
			if (xp > 0)
				sprintf(buf, "%sYou receive %d experience points.%s\n\r", get_char_color(gch, "white"), xp, END_COLOR(gch));
			else
				sprintf(buf, "%sYou receive no experience from this victory.%s\n\r", get_char_color(gch, "white"), END_COLOR(gch));
		}
		else
		{
			sprintf(buf, "%sYou have already reached the pinnacle of your learning.%s\n\r", get_char_color(gch, "white"), END_COLOR(gch));
		}

		send_to_char(buf, gch);
		gain_exp(gch, xp);
	}
}